

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_int8.h
# Opt level: O1

void ncnn::conv1x1s2_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  char *pcVar19;
  void *pvVar20;
  long lVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  int *piVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  void *pvVar31;
  void *pvVar32;
  
  iVar1 = top_blob->c;
  if (0 < (long)iVar1) {
    uVar2 = bottom_blob->c;
    lVar11 = (long)(int)uVar2;
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    pvVar5 = _kernel->data;
    lVar12 = (long)(bottom_blob->w * 2 + iVar3 * -2);
    pvVar6 = top_blob->data;
    sVar7 = top_blob->cstep;
    sVar8 = top_blob->elemsize;
    pvVar9 = bottom_blob->data;
    lVar13 = bottom_blob->cstep * bottom_blob->elemsize;
    lVar16 = 0;
    do {
      lVar17 = sVar7 * sVar8 * lVar16;
      uVar10 = top_blob->h * top_blob->w;
      if (0 < (int)uVar10) {
        memset((void *)((long)pvVar6 + lVar17),0,(ulong)uVar10 << 2);
      }
      piVar18 = (int *)(lVar17 + (long)pvVar6);
      uVar15 = 0;
      if (7 < (int)uVar2) {
        lVar17 = lVar16 * lVar11;
        uVar14 = 0;
        do {
          if (0 < iVar4) {
            pvVar20 = (void *)((uVar14 | 7) * lVar13 + (long)pvVar9);
            pvVar22 = (void *)((uVar14 | 6) * lVar13 + (long)pvVar9);
            pvVar23 = (void *)((uVar14 | 5) * lVar13 + (long)pvVar9);
            pvVar24 = (void *)((uVar14 | 4) * lVar13 + (long)pvVar9);
            pvVar25 = (void *)((uVar14 | 3) * lVar13 + (long)pvVar9);
            pvVar26 = (void *)((uVar14 | 2) * lVar13 + (long)pvVar9);
            pvVar32 = (void *)((uVar14 | 1) * lVar13 + (long)pvVar9);
            pvVar31 = (void *)(lVar13 * uVar14 + (long)pvVar9);
            iVar28 = 0;
            piVar27 = piVar18;
            do {
              if (0 < iVar3) {
                lVar29 = 0;
                lVar21 = 0;
                iVar30 = iVar3 + 1;
                do {
                  *(int *)((long)piVar27 + lVar21 * 2) =
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 6) *
                       (int)*(char *)((long)pvVar22 + lVar21) +
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 5) *
                       (int)*(char *)((long)pvVar23 + lVar21) +
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 4) *
                       (int)*(char *)((long)pvVar24 + lVar21) +
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 3) *
                       (int)*(char *)((long)pvVar25 + lVar21) +
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 2) *
                       (int)*(char *)((long)pvVar26 + lVar21) +
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 1) *
                       (int)*(char *)((long)pvVar32 + lVar21) +
                       (int)*(char *)((long)pvVar5 + uVar14 + lVar17) *
                       (int)*(char *)((long)pvVar31 + lVar21) + *(int *)((long)piVar27 + lVar21 * 2)
                       + (int)*(char *)((long)pvVar5 + uVar14 + lVar17 + 7) *
                         (int)*(char *)((long)pvVar20 + lVar21);
                  iVar30 = iVar30 + -1;
                  lVar21 = lVar21 + 2;
                  lVar29 = lVar29 + 4;
                } while (1 < iVar30);
                pvVar20 = (void *)((long)pvVar20 + lVar21);
                pvVar22 = (void *)((long)pvVar22 + lVar21);
                pvVar23 = (void *)((long)pvVar23 + lVar21);
                pvVar24 = (void *)((long)pvVar24 + lVar21);
                pvVar25 = (void *)((long)pvVar25 + lVar21);
                pvVar26 = (void *)((long)pvVar26 + lVar21);
                pvVar32 = (void *)((long)pvVar32 + lVar21);
                pvVar31 = (void *)((long)pvVar31 + lVar21);
                piVar27 = (int *)((long)piVar27 + lVar29);
              }
              pvVar31 = (void *)((long)pvVar31 + lVar12);
              pvVar32 = (void *)((long)pvVar32 + lVar12);
              pvVar26 = (void *)((long)pvVar26 + lVar12);
              pvVar25 = (void *)((long)pvVar25 + lVar12);
              pvVar24 = (void *)((long)pvVar24 + lVar12);
              pvVar23 = (void *)((long)pvVar23 + lVar12);
              pvVar22 = (void *)((long)pvVar22 + lVar12);
              pvVar20 = (void *)((long)pvVar20 + lVar12);
              iVar28 = iVar28 + 1;
            } while (iVar28 != iVar4);
          }
          uVar15 = uVar14 + 8;
          lVar21 = uVar14 + 0xf;
          uVar14 = uVar15;
        } while (lVar21 < lVar11);
      }
      if ((int)uVar15 < (int)uVar2) {
        uVar15 = uVar15 & 0xffffffff;
        do {
          if (0 < iVar4) {
            pcVar19 = (char *)(lVar13 * uVar15 + (long)pvVar9);
            iVar28 = 0;
            piVar27 = piVar18;
            do {
              iVar30 = iVar3 + 1;
              if (0 < iVar3) {
                do {
                  *piVar27 = *piVar27 +
                             (int)*(char *)((long)pvVar5 + uVar15 + lVar16 * lVar11) * (int)*pcVar19
                  ;
                  pcVar19 = pcVar19 + 2;
                  piVar27 = piVar27 + 1;
                  iVar30 = iVar30 + -1;
                } while (1 < iVar30);
              }
              pcVar19 = pcVar19 + lVar12;
              iVar28 = iVar28 + 1;
            } while (iVar28 != iVar4);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar2);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar1);
  }
  return;
}

Assistant:

static void conv1x1s2_int8_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;
    const signed char *kernel = _kernel;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        out0.fill(0);

        int q = 0;

        for (; q+7<inch; q+=8)
        {
            int* outptr0 = out0;

            const signed char *kernel0 = (const signed char *)kernel + p * inch + q;

            const signed char *r0 = bottom_blob.channel(q);
            const signed char *r1 = bottom_blob.channel(q + 1);
            const signed char *r2 = bottom_blob.channel(q + 2);
            const signed char *r3 = bottom_blob.channel(q + 3);
            const signed char *r4 = bottom_blob.channel(q + 4);
            const signed char *r5 = bottom_blob.channel(q + 5);
            const signed char *r6 = bottom_blob.channel(q + 6);
            const signed char *r7 = bottom_blob.channel(q + 7);

            for(int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    //ToDo Neon
                    int sum0 = (int)*r0 * (int)kernel0[0] + (int)*r1 * (int)kernel0[1] +
                            (int)*r2 * (int)kernel0[2] + (int)*r3 * (int)kernel0[3] +
                            (int)*r4 * (int)kernel0[4] + (int)*r5 * (int)kernel0[5] +
                            (int)*r6 * (int)kernel0[6] + (int)*r7 * (int)kernel0[7];

                    *outptr0 += sum0;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    r4 += 2;
                    r5 += 2;
                    r6 += 2;
                    r7 += 2;
                    outptr0++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
                r4 += tailstep;
                r5 += tailstep;
                r6 += tailstep;
                r7 += tailstep;
            }
        }

        for (; q<inch; q++)
        {
            int* outptr0 = out0;

            const signed char *r0 = bottom_blob.channel(q);

            const signed char *kernel0 = (const signed char *)kernel + p * inch + q;

            for(int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    //ToDo Neon
                    int sum0 = (int)*r0 * (int)kernel0[0];

                    *outptr0 += sum0;

                    r0 += 2;
                    outptr0++;
                }

                r0 += tailstep;
            }
        }
    }
}